

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1024,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool in_stack_0000001b;
  bool in_stack_0000001c;
  bool in_stack_0000001d;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  bool result;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000020;
  Blob<128> h;
  keytype k;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  undefined4 in_stack_ffffffffffffff38;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff3c;
  uint8_t in_stack_ffffffffffffff47;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  pfHash in_stack_ffffffffffffff50;
  Blob<1024> local_a8;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x400,pcVar4,(ulong)in_ESI);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x15c0bf);
  Blob<1024>::Blob(&local_a8);
  memset(&local_a8,0,0x80);
  if ((local_d & 1) != 0) {
    Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff3c);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&local_a8,0x80,0,&stack0xffffffffffffff3c);
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX),
               (value_type *)CONCAT44(in_ECX,in_R8D));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1024>,Blob<128>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
             (bool)in_stack_ffffffffffffff47,
             (Blob<1024> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX));
  sVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<Blob<128>>
                    (in_stack_00000020,in_stack_0000001f,in_stack_0000001e,in_stack_0000001d,
                     in_stack_0000001c,in_stack_0000001b);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}